

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O2

completion * __thiscall
mjs::interpreter::impl::operator()(completion *__return_storage_ptr__,impl *this,with_statement *s)

{
  long *plVar1;
  auto_scope with_scope;
  value val;
  gc_heap_ptr_untyped local_80;
  value local_70;
  value local_48;
  
  eval(&local_70,this,
       (s->e_)._M_t.super___uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>.
       _M_t.super__Tuple_impl<0UL,_mjs::expression_*,_std::default_delete<mjs::expression>_>.
       super__Head_base<0UL,_mjs::expression_*,_false>._M_head_impl);
  get_value(&local_48,this,&local_70);
  value::~value(&local_70);
  plVar1 = (long *)gc_heap_ptr_untyped::get(&(this->global_).super_gc_heap_ptr_untyped);
  (**(code **)(*plVar1 + 0x88))(&local_80,plVar1,&local_48);
  auto_scope::auto_scope((auto_scope *)&local_70,this,(object_ptr *)&local_80,&this->active_scope_);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_80);
  eval(__return_storage_ptr__,this,
       (s->s_)._M_t.super___uniq_ptr_impl<mjs::statement,_std::default_delete<mjs::statement>_>._M_t
       .super__Tuple_impl<0UL,_mjs::statement_*,_std::default_delete<mjs::statement>_>.
       super__Head_base<0UL,_mjs::statement_*,_false>._M_head_impl);
  auto_scope::~auto_scope((auto_scope *)&local_70);
  value::~value(&local_48);
  return __return_storage_ptr__;
}

Assistant:

completion operator()(const with_statement& s) {
        auto val = get_value(eval(s.e()));
        auto_scope with_scope{*this, global_->to_object(val), active_scope_};
        return eval(s.s());
    }